

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O1

Variable __thiscall
runtime::VirtualMachine::loadClosureValue(VirtualMachine *this,Function *fn,size_t index)

{
  pointer pCVar1;
  long lVar2;
  long lVar3;
  Variable VVar4;
  string local_38;
  
  pCVar1 = (fn->captures).
           super__Vector_base<runtime::ClosureContext,_std::allocator<runtime::ClosureContext>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(fn->captures).
                    super__Vector_base<runtime::ClosureContext,_std::allocator<runtime::ClosureContext>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1 >> 4) <= index) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"Index out of bounds in loadClosureValue","");
    panic(this,&local_38);
  }
  lVar2 = *(long *)&((pCVar1[index].stackFrame)->locals).
                    super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>;
  if (pCVar1[index].scopeIndex <
      (ulong)((long)*(pointer *)((long)&(pCVar1[index].stackFrame)->locals + 8) - lVar2 >> 4)) {
    lVar3 = pCVar1[index].scopeIndex * 0x10;
    VVar4._4_4_ = 0;
    VVar4.type = *(uint *)(lVar2 + lVar3);
    VVar4.field_1.integerValue =
         ((anon_union_8_6_52c89740_for_Variable_1 *)(lVar2 + 8 + lVar3))->integerValue;
    return VVar4;
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"Scope index >= closure.stackFrame->locals.size()","");
  panic(this,&local_38);
}

Assistant:

runtime::Variable runtime::VirtualMachine::loadClosureValue(const runtime::Function* fn, std::size_t index) {
  auto& closures = fn->captures;

  if (index >= closures.size()) {
    this->panic("Index out of bounds in loadClosureValue");
  }

  const auto& closure = closures.at(index);

  if (closure.scopeIndex >= closure.stackFrame->locals.size()) {
    this->panic("Scope index >= closure.stackFrame->locals.size()");
  }

  return closure.stackFrame->locals.at(closure.scopeIndex);
}